

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Module::removeGlobals(Module *this,function<bool_(wasm::Global_*)> *pred)

{
  function<bool_(wasm::Global_*)> local_38;
  function<bool_(wasm::Global_*)> *local_18;
  function<bool_(wasm::Global_*)> *pred_local;
  Module *this_local;
  
  local_18 = pred;
  pred_local = (function<bool_(wasm::Global_*)> *)this;
  std::function<bool_(wasm::Global_*)>::function(&local_38,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>,std::allocator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>>>,std::unordered_map<wasm::Name,wasm::Global*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Global*>>>,wasm::Global>
            (&this->globals,&this->globalsMap,&local_38);
  std::function<bool_(wasm::Global_*)>::~function(&local_38);
  return;
}

Assistant:

void Module::removeGlobals(std::function<bool(Global*)> pred) {
  removeModuleElements(globals, globalsMap, pred);
}